

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O1

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfoCore<double,double>
               (SnapArrayInfo<double> *arrayInfo,JavascriptArray *arrayObj,InflateMap *inflator)

{
  SnapArrayInfoBlock<double> *pSVar1;
  ulong uVar2;
  double newValue;
  
  for (pSVar1 = arrayInfo->Data; pSVar1 != (SnapArrayInfoBlock<double> *)0x0; pSVar1 = pSVar1->Next)
  {
    if (pSVar1->LastIndex != pSVar1->FirstIndex) {
      uVar2 = 0;
      do {
        if (pSVar1->ArrayValidTags[uVar2] != '\0') {
          newValue = SnapArrayInfo_InflateValue(pSVar1->ArrayRangeContents[uVar2],inflator);
          Js::JavascriptArray::DirectSetItemAt<double>
                    (arrayObj,pSVar1->FirstIndex + (int)uVar2,newValue);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < pSVar1->LastIndex - pSVar1->FirstIndex);
    }
  }
  Js::JavascriptArray::SetLength(arrayObj,arrayInfo->Length);
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, Js::JavascriptArray* arrayObj, InflateMap* inflator)
        {
            const SnapArrayInfoBlock<T>* dataBlock = arrayInfo->Data;

            while(dataBlock != nullptr)
            {
                for(uint32 i = 0; i < (dataBlock->LastIndex - dataBlock->FirstIndex); ++i)
                {
                    if(dataBlock->ArrayValidTags[i])
                    {
                        T ttdVal = dataBlock->ArrayRangeContents[i];
                        U jsVal = SnapArrayInfo_InflateValue(ttdVal, inflator);

                        arrayObj->DirectSetItemAt<U>(i + dataBlock->FirstIndex, jsVal);
                    }
                }
                dataBlock = dataBlock->Next;
            }

            //Ensure this value is set correctly in case of sparse arrays
            arrayObj->SetLength(arrayInfo->Length);
        }